

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O1

QVariant * qDateTimeFromString(QVariant *__return_storage_ptr__,QString *val)

{
  long lVar1;
  char cVar2;
  longlong lVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QDateTime local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (val->d).size;
  if (lVar1 == 0xe) {
    lVar3 = QString::insert((longlong)val,(QChar)0x4);
    lVar3 = QString::insert(lVar3,(QChar)0x7);
    lVar3 = QString::insert(lVar3,(QChar)0xa);
    lVar3 = QString::insert(lVar3,(QChar)0xd);
    QString::insert(lVar3,(QChar)0x10);
  }
  else if (lVar1 == 0) {
    QDateTime::QDateTime(local_20);
    goto LAB_0010aa3b;
  }
  cVar2 = QString::endsWith((QChar)(char16_t)val,0x5a);
  if (cVar2 == '\0') {
    QString::append((QChar)(char16_t)val);
  }
  QVar4.m_data = (storage_type_conflict *)(val->d).size;
  QVar4.m_size = (qsizetype)local_20;
  QDateTime::fromString(QVar4,(DateFormat)(val->d).ptr);
LAB_0010aa3b:
  QVariant::QVariant(__return_storage_ptr__,local_20);
  QDateTime::~QDateTime(local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static inline QVariant qDateTimeFromString(QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QDateTime());

    // TIMESTAMPS have either the format "yyyyMMddhhmmss" or "yyyy-MM-dd
    // hh:mm:ss". QDateTime::fromString() can convert the latter, but not the
    // former, so adapt it if necessary.
    if (val.size() == 14)
        val.insert(4, u'-').insert(7, u'-').insert(10, u'T').insert(13, u':').insert(16, u':');

    if (!val.endsWith(u'Z'))
        val.append(u'Z');       // make UTC
    return QVariant(QDateTime::fromString(val, Qt::ISODate));
#endif
}